

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O3

void CPU::WDC65816::ProcessorStorageConstructor::stack_pea
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_d [5];
  
  local_d[0] = CycleFetchIncrementPC;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_d);
    local_d[1] = 0;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_d + 1);
      local_d[2] = 0x31;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_d + 2);
        local_d[3] = 0x17;
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,local_d + 3);
          local_d[4] = 0x17;
          if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
            (*target->_M_invoker)((_Any_data *)target,local_d + 4);
            return;
          }
        }
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void stack_pea(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);	// AAL.
		target(CycleFetchIncrementPC);	// AAH.

		target(OperationCopyInstructionToData);

		target(CyclePushNotEmulation);	// AAH.
		target(CyclePushNotEmulation);	// AAL.
	}